

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<double>::Extract
          (TPZDohrAssembly<double> *this,int isub,TPZFMatrix<double> *global,
          TPZFMatrix<double> *local)

{
  TPZVec<int> *pTVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  ulong row;
  ulong col;
  ulong uVar6;
  double extraout_XMM0_Qa;
  
  pTVar1 = (this->fFineEqs).fStore;
  uVar6 = pTVar1[isub].fNElements;
  uVar5 = (global->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  iVar2 = (int)uVar6;
  iVar4 = (int)uVar5;
  (*(local->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (local,(long)iVar2,(long)iVar4);
  col = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar2 < 1) {
    uVar6 = col;
  }
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = col;
  }
  for (; col != uVar5; col = col + 1) {
    for (row = 0; uVar6 != row; row = row + 1) {
      (*(global->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(global,(long)pTVar1[isub].fStore[row],col);
      pdVar3 = TPZFMatrix<double>::operator()(local,row,col);
      *pdVar3 = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Extract(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = global.Cols();
	int ieq;
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "sub structure " << isub << " Extracting destination indices " << avec << std::endl;
		local.Print("extracted vector",sout);
		global.Print("Global vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}